

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCustomAttributes.cpp
# Opt level: O2

void testCustomAttributes(string *tempDir)

{
  _Rb_tree_header *p_Var1;
  bool ytc;
  bool ytc_00;
  ostream *poVar2;
  ChannelList *this;
  Header *pHVar3;
  TypedAttribute<int> *pTVar4;
  OpaqueAttribute *pOVar5;
  TypedAttribute<Imf_2_5::Glorp> *pTVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  undefined1 xtc;
  int iVar11;
  long lVar12;
  OutputFile out;
  FrameBuffer fb;
  Array2D<float> pf;
  Header hdr;
  string filename;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing custom attributes");
  std::endl<char,std::char_traits<char>>(poVar2);
  pf._sizeX = 0xc5;
  pf._sizeY = 0xd9;
  pf._data = (float *)operator_new__(0x29bf4);
  iVar10 = 0;
  xtc = 10;
  pfVar7 = pf._data;
  for (uVar8 = 0; uVar8 != 0xc5; uVar8 = uVar8 + 1) {
    iVar11 = iVar10 + (int)((uVar8 & 0xffffffff) / 0x11) * -0xaa;
    uVar9 = 0;
    lVar12 = 0;
    while( true ) {
      if (lVar12 == 0x364) break;
      *(float *)((long)pfVar7 + lVar12) = (float)(iVar11 + (int)(uVar9 / 10) * -10);
      lVar12 = lVar12 + 4;
      iVar11 = iVar11 + 1;
      uVar9 = (ulong)((int)uVar9 + 1);
    }
    pfVar7 = pfVar7 + 0xd9;
    iVar10 = iVar10 + 10;
  }
  std::operator+(&filename,tempDir,"imf_test_custom_attr.exr");
  Imf_2_5::TypedAttribute<Imf_2_5::Glorp>::registerAttributeType();
  out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
  Imf_2_5::Header::Header(&hdr,0xd9,0xc5,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  fb._map._M_t._M_impl._0_4_ = 0x19;
  Imf_2_5::TypedAttribute<int>::TypedAttribute((TypedAttribute<int> *)&out,(int *)&fb);
  Imf_2_5::Header::insert(&hdr,"custom1",(Attribute *)&out);
  Imf_2_5::Attribute::~Attribute((Attribute *)&out);
  fb._map._M_t._M_impl._0_8_ = 0x900000004;
  Imf_2_5::TypedAttribute<Imf_2_5::Glorp>::TypedAttribute
            ((TypedAttribute<Imf_2_5::Glorp> *)&out,(Glorp *)&fb);
  Imf_2_5::Header::insert(&hdr,"custom2",(Attribute *)&out);
  Imf_2_5::Attribute::~Attribute((Attribute *)&out);
  this = Imf_2_5::Header::channels(&hdr);
  Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
  Imf_2_5::ChannelList::insert(this,"F",(Channel *)&out);
  p_Var1 = &fb._map._M_t._M_impl.super__Rb_tree_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_2_5::Slice::Slice((Slice *)&out,FLOAT,(char *)pf._data,4,0x364,1,1,0.0,(bool)xtc,ytc);
  Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
  std::operator<<((ostream *)&std::cout,"writing");
  std::ostream::flush();
  remove(filename._M_dataplus._M_p);
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::OutputFile::OutputFile(&out,filename._M_dataplus._M_p,&hdr,iVar10);
  Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
  Imf_2_5::OutputFile::writePixels(&out,0xc5);
  Imf_2_5::OutputFile::~OutputFile(&out);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&fb);
  Imf_2_5::Header::~Header(&hdr);
  Imf_2_5::TypedAttribute<Imf_2_5::Glorp>::unRegisterAttributeType();
  out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
  Imf_2_5::Header::Header(&hdr,0x40,0x40,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  std::operator<<((ostream *)&std::cout," reading");
  std::ostream::flush();
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile((InputFile *)&out,filename._M_dataplus._M_p,iVar10);
  pHVar3 = Imf_2_5::InputFile::header((InputFile *)&out);
  pTVar4 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<int>>(pHVar3,"custom1");
  pHVar3 = Imf_2_5::InputFile::header((InputFile *)&out);
  pOVar5 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::OpaqueAttribute>(pHVar3,"custom2");
  if ((pTVar4 == (TypedAttribute<int> *)0x0) || (pTVar4->_value != 0x19)) {
    __assert_fail("c1 != 0 && c1->value() == 25",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testCustomAttributes.cpp"
                  ,0xbf,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  if (pOVar5 == (OpaqueAttribute *)0x0) {
    __assert_fail("c2 != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testCustomAttributes.cpp"
                  ,0xc0,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pHVar3 = Imf_2_5::InputFile::header((InputFile *)&out);
  Imf_2_5::Header::operator=(&hdr,pHVar3);
  Imf_2_5::InputFile::~InputFile((InputFile *)&out);
  Imf_2_5::TypedAttribute<Imf_2_5::Glorp>::registerAttributeType();
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_2_5::Slice::Slice((Slice *)&out,FLOAT,(char *)pf._data,4,0x364,1,1,0.0,(bool)xtc,ytc_00);
  Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
  std::operator<<((ostream *)&std::cout," writing");
  std::ostream::flush();
  remove(filename._M_dataplus._M_p);
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::OutputFile::OutputFile(&out,filename._M_dataplus._M_p,&hdr,iVar10);
  Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
  Imf_2_5::OutputFile::writePixels(&out,0xc5);
  Imf_2_5::OutputFile::~OutputFile(&out);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&fb);
  std::operator<<((ostream *)&std::cout," reading");
  std::ostream::flush();
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile((InputFile *)&out,filename._M_dataplus._M_p,iVar10);
  pHVar3 = Imf_2_5::InputFile::header((InputFile *)&out);
  pTVar4 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<int>>(pHVar3,"custom1");
  pHVar3 = Imf_2_5::InputFile::header((InputFile *)&out);
  pTVar6 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::Glorp>>
                     (pHVar3,"custom2");
  if ((pTVar4 != (TypedAttribute<int> *)0x0) && (pTVar4->_value == 0x19)) {
    if (((pTVar6 != (TypedAttribute<Imf_2_5::Glorp> *)0x0) && ((pTVar6->_value).a == 4)) &&
       ((pTVar6->_value).b == 9)) {
      Imf_2_5::InputFile::~InputFile((InputFile *)&out);
      remove(filename._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      Imf_2_5::Header::~Header(&hdr);
      poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&filename);
      Imf_2_5::Array2D<float>::~Array2D(&pf);
      return;
    }
    __assert_fail("c2 != 0 && c2->value().a == 4 && c2->value().b == 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testCustomAttributes.cpp"
                  ,0xf7,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  __assert_fail("c1 != 0 && c1->value() == 25",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testCustomAttributes.cpp"
                ,0xf6,
                "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
               );
}

Assistant:

void
testCustomAttributes (const std::string &tempDir)
{
    try
    {
	cout << "Testing custom attributes" << endl;

	const int W = 217;
	const int H = 197;

	Array2D<float> pf (H, W);
	fillPixels (pf, W, H);

	std::string filename = tempDir + "imf_test_custom_attr.exr";

	writeReadCustomAttr (pf, filename.c_str(), W, H);

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}